

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_sse2.c
# Opt level: O2

void aom_fft_unpack_2d_output_sse2(float *packed,float *output,int n)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint uVar19;
  long lVar20;
  float *pfVar21;
  int iVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  float *pfVar32;
  float *pfVar33;
  long lVar34;
  float *pfVar35;
  long lVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  int c_1;
  long lVar40;
  long local_80;
  long local_78;
  
  uVar19 = n / 2;
  *output = *packed;
  output[1] = 0.0;
  iVar22 = uVar19 * n;
  lVar34 = (long)iVar22;
  output[iVar22 * 2] = packed[lVar34];
  output[iVar22 * 2 + 1] = 0.0;
  lVar20 = (long)(int)uVar19;
  pfVar1 = packed + lVar20;
  output[(int)(uVar19 * 2)] = *pfVar1;
  output[(int)(uVar19 * 2 + 1)] = 0.0;
  iVar22 = uVar19 + iVar22;
  output[iVar22 * 2] = packed[iVar22];
  output[iVar22 * 2 + 1] = 0.0;
  for (lVar30 = 1; lVar30 < lVar20; lVar30 = lVar30 + 1) {
    output[lVar30 * 2] = packed[lVar30];
    output[lVar30 * 2 + 1] = pfVar1[lVar30];
    output[lVar34 * 2 + lVar30 * 2] = (packed + lVar34)[lVar30];
    output[lVar34 * 2 + lVar30 * 2 + 1] = packed[lVar20 + lVar34 + lVar30];
  }
  uVar29 = 4;
  if ((int)uVar19 < 4) {
    uVar29 = (ulong)uVar19;
  }
  lVar30 = (long)n;
  pfVar33 = packed + lVar30 + lVar20;
  lVar36 = (lVar20 + 1) * lVar30;
  pfVar24 = packed + lVar36 + lVar20;
  pfVar39 = packed + lVar36;
  lVar34 = lVar30 << 0x21;
  local_80 = lVar34 + 0xc00000000;
  lVar31 = ((lVar30 + -1) - lVar20) * lVar30;
  pfVar38 = packed + lVar31 + lVar20;
  pfVar25 = output + lVar36 * 2;
  local_78 = (lVar36 << 0x21) + 0xc00000000;
  pfVar23 = packed + lVar31;
  lVar31 = (lVar30 + -1) * lVar30;
  pfVar37 = packed + lVar31 + lVar20;
  pfVar35 = packed + lVar31;
  pfVar32 = output + lVar30 * 2;
  pfVar21 = packed + lVar30;
  for (lVar31 = 1; lVar31 < lVar20; lVar31 = lVar31 + 1) {
    lVar27 = lVar31 * lVar30;
    output[lVar27 * 2] = packed[lVar27];
    lVar36 = (lVar31 + lVar20) * lVar30;
    output[lVar27 * 2 + 1] = packed[lVar36];
    lVar27 = lVar27 + lVar20;
    output[lVar27 * 2] = packed[lVar27];
    lVar26 = lVar36 + lVar20;
    output[lVar27 * 2 + 1] = packed[lVar26];
    for (uVar28 = 1; uVar29 != uVar28; uVar28 = uVar28 + 1) {
      pfVar32[uVar28 * 2] = pfVar21[uVar28] - pfVar24[uVar28];
      pfVar32[uVar28 * 2 + 1] = pfVar39[uVar28] + pfVar33[uVar28];
    }
    lVar27 = local_80;
    for (lVar40 = 4; lVar40 < lVar20; lVar40 = lVar40 + 4) {
      pfVar4 = pfVar21 + lVar40;
      fVar5 = pfVar4[1];
      fVar6 = pfVar4[2];
      fVar7 = pfVar4[3];
      pfVar2 = pfVar24 + lVar40;
      fVar8 = pfVar2[1];
      fVar9 = pfVar2[2];
      fVar10 = pfVar2[3];
      pfVar3 = pfVar39 + lVar40;
      fVar11 = *pfVar3;
      fVar12 = pfVar3[1];
      fVar13 = pfVar3[2];
      fVar14 = pfVar3[3];
      pfVar3 = pfVar33 + lVar40;
      fVar15 = *pfVar3;
      fVar16 = pfVar3[1];
      fVar17 = pfVar3[2];
      fVar18 = pfVar3[3];
      pfVar3 = pfVar32 + lVar40 * 2;
      *pfVar3 = *pfVar4 - *pfVar2;
      pfVar3[1] = fVar11 + fVar15;
      pfVar3[2] = fVar5 - fVar8;
      pfVar3[3] = fVar12 + fVar16;
      pfVar4 = (float *)((long)output + (lVar27 >> 0x1e));
      *pfVar4 = fVar6 - fVar9;
      pfVar4[1] = fVar13 + fVar17;
      pfVar4[2] = fVar7 - fVar10;
      pfVar4[3] = fVar14 + fVar18;
      lVar27 = lVar27 + 0x800000000;
    }
    lVar27 = lVar30 - (lVar31 + lVar20);
    lVar40 = lVar27 * lVar30;
    output[lVar36 * 2] = packed[lVar40];
    lVar27 = (lVar27 + lVar20) * lVar30;
    output[lVar36 * 2 + 1] = -packed[lVar27];
    output[lVar26 * 2] = pfVar1[lVar40];
    output[lVar26 * 2 + 1] = -pfVar1[lVar27];
    for (uVar28 = 1; uVar29 != uVar28; uVar28 = uVar28 + 1) {
      pfVar25[uVar28 * 2] = pfVar23[uVar28] + pfVar37[uVar28];
      pfVar25[uVar28 * 2 + 1] = pfVar38[uVar28] - pfVar35[uVar28];
    }
    lVar36 = local_78;
    for (lVar26 = 4; lVar26 < lVar20; lVar26 = lVar26 + 4) {
      pfVar4 = pfVar23 + lVar26;
      fVar5 = pfVar4[1];
      fVar6 = pfVar4[2];
      fVar7 = pfVar4[3];
      pfVar2 = pfVar37 + lVar26;
      fVar8 = pfVar2[1];
      fVar9 = pfVar2[2];
      fVar10 = pfVar2[3];
      pfVar3 = pfVar38 + lVar26;
      fVar11 = *pfVar3;
      fVar12 = pfVar3[1];
      fVar13 = pfVar3[2];
      fVar14 = pfVar3[3];
      pfVar3 = pfVar35 + lVar26;
      fVar15 = *pfVar3;
      fVar16 = pfVar3[1];
      fVar17 = pfVar3[2];
      fVar18 = pfVar3[3];
      pfVar3 = pfVar25 + lVar26 * 2;
      *pfVar3 = *pfVar4 + *pfVar2;
      pfVar3[1] = fVar11 - fVar15;
      pfVar3[2] = fVar5 + fVar8;
      pfVar3[3] = fVar12 - fVar16;
      pfVar4 = (float *)((long)output + (lVar36 >> 0x1e));
      *pfVar4 = fVar6 + fVar9;
      pfVar4[1] = fVar13 - fVar17;
      pfVar4[2] = fVar7 + fVar10;
      pfVar4[3] = fVar14 - fVar18;
      lVar36 = lVar36 + 0x800000000;
    }
    pfVar33 = pfVar33 + lVar30;
    pfVar32 = pfVar32 + lVar30 * 2;
    pfVar21 = pfVar21 + lVar30;
    pfVar24 = pfVar24 + lVar30;
    pfVar39 = pfVar39 + lVar30;
    local_80 = local_80 + lVar34;
    pfVar38 = pfVar38 + -lVar30;
    pfVar23 = pfVar23 + -lVar30;
    pfVar37 = pfVar37 + -lVar30;
    pfVar35 = pfVar35 + -lVar30;
    pfVar25 = pfVar25 + lVar30 * 2;
    local_78 = local_78 + lVar34;
  }
  return;
}

Assistant:

void aom_fft_unpack_2d_output_sse2(const float *packed, float *output, int n) {
  const int n2 = n / 2;
  output[0] = packed[0];
  output[1] = 0;
  output[2 * (n2 * n)] = packed[n2 * n];
  output[2 * (n2 * n) + 1] = 0;

  output[2 * n2] = packed[n2];
  output[2 * n2 + 1] = 0;
  output[2 * (n2 * n + n2)] = packed[n2 * n + n2];
  output[2 * (n2 * n + n2) + 1] = 0;

  for (int c = 1; c < n2; ++c) {
    output[2 * (0 * n + c)] = packed[c];
    output[2 * (0 * n + c) + 1] = packed[c + n2];
    output[2 * (n2 * n + c) + 0] = packed[n2 * n + c];
    output[2 * (n2 * n + c) + 1] = packed[n2 * n + c + n2];
  }
  for (int r = 1; r < n2; ++r) {
    output[2 * (r * n + 0)] = packed[r * n];
    output[2 * (r * n + 0) + 1] = packed[(r + n2) * n];
    output[2 * (r * n + n2) + 0] = packed[r * n + n2];
    output[2 * (r * n + n2) + 1] = packed[(r + n2) * n + n2];

    for (int c = 1; c < AOMMIN(n2, 4); ++c) {
      output[2 * (r * n + c)] =
          packed[r * n + c] - packed[(r + n2) * n + c + n2];
      output[2 * (r * n + c) + 1] =
          packed[(r + n2) * n + c] + packed[r * n + c + n2];
    }

    for (int c = 4; c < n2; c += 4) {
      __m128 real1 = _mm_load_ps(packed + r * n + c);
      __m128 real2 = _mm_load_ps(packed + (r + n2) * n + c + n2);
      __m128 imag1 = _mm_load_ps(packed + (r + n2) * n + c);
      __m128 imag2 = _mm_load_ps(packed + r * n + c + n2);
      real1 = _mm_sub_ps(real1, real2);
      imag1 = _mm_add_ps(imag1, imag2);
      _mm_store_ps(output + 2 * (r * n + c), _mm_unpacklo_ps(real1, imag1));
      _mm_store_ps(output + 2 * (r * n + c + 2), _mm_unpackhi_ps(real1, imag1));
    }

    int r2 = r + n2;
    int r3 = n - r2;
    output[2 * (r2 * n + 0)] = packed[r3 * n];
    output[2 * (r2 * n + 0) + 1] = -packed[(r3 + n2) * n];
    output[2 * (r2 * n + n2)] = packed[r3 * n + n2];
    output[2 * (r2 * n + n2) + 1] = -packed[(r3 + n2) * n + n2];
    for (int c = 1; c < AOMMIN(4, n2); ++c) {
      output[2 * (r2 * n + c)] =
          packed[r3 * n + c] + packed[(r3 + n2) * n + c + n2];
      output[2 * (r2 * n + c) + 1] =
          -packed[(r3 + n2) * n + c] + packed[r3 * n + c + n2];
    }
    for (int c = 4; c < n2; c += 4) {
      __m128 real1 = _mm_load_ps(packed + r3 * n + c);
      __m128 real2 = _mm_load_ps(packed + (r3 + n2) * n + c + n2);
      __m128 imag1 = _mm_load_ps(packed + (r3 + n2) * n + c);
      __m128 imag2 = _mm_load_ps(packed + r3 * n + c + n2);
      real1 = _mm_add_ps(real1, real2);
      imag1 = _mm_sub_ps(imag2, imag1);
      _mm_store_ps(output + 2 * (r2 * n + c), _mm_unpacklo_ps(real1, imag1));
      _mm_store_ps(output + 2 * (r2 * n + c + 2),
                   _mm_unpackhi_ps(real1, imag1));
    }
  }
}